

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.cpp
# Opt level: O0

void cashew::dump(char *str,Ref node,bool pretty)

{
  bool bVar1;
  ostream *poVar2;
  Value *this;
  bool pretty_local;
  char *str_local;
  Ref node_local;
  
  str_local = (char *)node.inst;
  poVar2 = std::operator<<((ostream *)&std::cerr,str);
  std::operator<<(poVar2,": ");
  bVar1 = Ref::operator!((Ref *)&str_local);
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"(nullptr)");
  }
  else {
    this = Ref::operator->((Ref *)&str_local);
    Value::stringify(this,(ostream *)&std::cerr,pretty);
  }
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void dump(const char* str, Ref node, bool pretty) {
  std::cerr << str << ": ";
  if (!!node) {
    node->stringify(std::cerr, pretty);
  } else {
    std::cerr << "(nullptr)";
  }
  std::cerr << std::endl;
}